

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O2

ggml_backend_dev_t ggml_backend_cpu_reg_get_device(ggml_backend_reg_t reg,size_t index)

{
  int iVar1;
  
  if (index == 0) {
    if (ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)::ctx == '\0') {
      iVar1 = __cxa_guard_acquire(&ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)
                                   ::ctx);
      if (iVar1 != 0) {
        ggml_backend_cpu_device_context::ggml_backend_cpu_device_context
                  (&ggml_backend_cpu_reg_get_device::ctx);
        __cxa_atexit(ggml_backend_cpu_device_context::~ggml_backend_cpu_device_context,
                     &ggml_backend_cpu_reg_get_device::ctx,&__dso_handle);
        __cxa_guard_release(&ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)::ctx);
      }
    }
    if (ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)::ggml_backend_cpu_device ==
        '\0') {
      iVar1 = __cxa_guard_acquire(&ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)
                                   ::ggml_backend_cpu_device);
      if (iVar1 != 0) {
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.buffer_from_host_ptr =
             ggml_backend_cpu_device_buffer_from_host_ptr;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.supports_op =
             ggml_backend_cpu_device_supports_op;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.supports_buft =
             ggml_backend_cpu_device_supports_buft;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.offload_op =
             (_func__Bool_ggml_backend_dev_t_ggml_tensor_ptr *)0x0;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.event_new =
             (_func_ggml_backend_event_t_ggml_backend_dev_t *)0x0;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.event_free =
             (_func_void_ggml_backend_dev_t_ggml_backend_event_t *)0x0;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.event_synchronize =
             (_func_void_ggml_backend_dev_t_ggml_backend_event_t *)0x0;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.get_name =
             ggml_backend_cpu_device_get_name;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.get_description =
             ggml_backend_cpu_device_get_description;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.get_memory =
             ggml_backend_cpu_device_get_memory;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.get_type =
             ggml_backend_cpu_device_get_type;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.get_props =
             ggml_backend_cpu_device_get_props;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.init_backend =
             ggml_backend_cpu_device_init_backend;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.get_buffer_type =
             ggml_backend_cpu_device_get_buffer_type;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.iface.get_host_buffer_type =
             (_func_ggml_backend_buffer_type_t_ggml_backend_dev_t *)0x0;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.context =
             &ggml_backend_cpu_reg_get_device::ctx;
        ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device.reg = reg;
        __cxa_guard_release(&ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)::
                             ggml_backend_cpu_device);
      }
    }
    return &ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.cpp"
             ,0x1dc,"GGML_ASSERT(%s) failed","index == 0");
}

Assistant:

static ggml_backend_dev_t ggml_backend_cpu_reg_get_device(ggml_backend_reg_t reg, size_t index) {
    GGML_ASSERT(index == 0);

    static ggml_backend_cpu_device_context ctx;
    static ggml_backend_device ggml_backend_cpu_device = {
        /* .iface   = */ ggml_backend_cpu_device_i,
        /* .reg     = */ reg,
        /* .context = */ &ctx,
    };

    return &ggml_backend_cpu_device;
}